

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

string * __thiscall DataRefs::GetXPSimTimeStr_abi_cxx11_(DataRefs *this)

{
  string *in_RDI;
  tm xp_tm;
  time_t xp_t;
  char s [100];
  tm *result;
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char local_78 [120];
  
  result = (tm *)&stack0xffffffffffffff48;
  gmtime_s(result,(time_t *)in_RDI);
  strftime(local_78,100,"%Y-%m-%d %H:%M:%S UTC",(tm *)result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  return in_RDI;
}

Assistant:

std::string DataRefs::GetXPSimTimeStr() const
{
    char s[100];
    time_t xp_t = time_t(lastXPSimTime_ms / 1000L);
    struct tm xp_tm;
    gmtime_s(&xp_tm, &xp_t);
    std::strftime(s, sizeof(s), "%Y-%m-%d %H:%M:%S UTC", &xp_tm);
    return s;
}